

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::SamplerGLImpl,_Diligent::FixedBlockMemoryAllocator>::DestroyObject
          (ObjectWrapper<Diligent::SamplerGLImpl,_Diligent::FixedBlockMemoryAllocator> *this)

{
  SamplerGLImpl *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::SamplerGLImpl,_Diligent::FixedBlockMemoryAllocator> *this_local;
  
  if (this->m_pAllocator == (FixedBlockMemoryAllocator *)0x0) {
    this_00 = this->m_pObject;
    if (this_00 != (SamplerGLImpl *)0x0) {
      SamplerGLImpl::~SamplerGLImpl(this_00);
      RefCountedObject<Diligent::ISamplerGL>::operator_delete
                ((RefCountedObject<Diligent::ISamplerGL> *)this_00,in_RSI);
    }
  }
  else {
    SamplerGLImpl::~SamplerGLImpl(this->m_pObject);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }